

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXglFormat(ValidationContext *this,uint8_t *data,uint32_t size)

{
  _khr_df_model_e _Var1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ktxSupercmpScheme extraout_EDX;
  ktxSupercmpScheme extraout_EDX_00;
  ktxSupercmpScheme scheme;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_90;
  uint32_t local_6c;
  undefined8 local_68;
  uint local_60 [2];
  string local_58;
  
  this->foundKTXglFormat = true;
  uVar6 = (ulong)(this->header).vkFormat;
  local_6c = size;
  scheme = size;
  if (uVar6 != 0) {
    pcVar4 = (char *)vkFormatString(uVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar4,(allocator<char> *)&local_68);
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 == 0) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      local_68 = uVar6;
      ::fmt::v10::vformat_abi_cxx11_(&local_58,(v10 *)0x20aba6,fmt,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        local_58.field_2._8_8_ = local_90.field_2._8_8_;
      }
      else {
        local_58._M_dataplus._M_p = local_90._M_dataplus._M_p;
      }
      local_58.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
      local_58._M_string_length = local_90._M_string_length;
    }
    error<std::__cxx11::string>(this,&Metadata::KTXglFormatWithVkFormat,&local_58);
    scheme = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      scheme = extraout_EDX_00;
    }
  }
  if (size == 0xc) {
    uVar2 = *(undefined8 *)data;
    local_60[0] = *(uint *)(data + 8);
    local_68._4_4_ = (int)((ulong)uVar2 >> 0x20);
    if (local_60[0] != 0 || local_68._4_4_ != 0) {
      local_68 = uVar2;
      if ((this->header).supercompressionScheme == 1) {
        toString_abi_cxx11_(&local_90,(ktx *)0x1,scheme);
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_68 + 4),local_60,&local_90);
      }
      else {
        if ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
            super__Optional_payload_base<_khr_df_model_e>._M_engaged != true) {
          return;
        }
        _Var1 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>.
                _M_payload.super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
        if ((long)(int)_Var1 < 0x80) {
          return;
        }
        pcVar4 = (char *)dfdToStringColorModel(_Var1);
        if (pcVar4 == (char *)0x0) {
          fmt_00.size_ = 2;
          fmt_00.data_ = (char *)0xa;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_58;
          local_58._M_dataplus._M_p = (pointer)(long)(int)_Var1;
          ::fmt::v10::vformat_abi_cxx11_(&local_90,(v10 *)"(0x{:02X})",fmt_00,args_00);
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          sVar5 = strlen(pcVar4);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar4,pcVar4 + sVar5)
          ;
        }
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_68 + 4),local_60,&local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    error<unsigned_int&>(this,&Metadata::KTXglFormatInvalidSize,&local_6c);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXglFormat(const uint8_t* data, uint32_t size) {
    foundKTXglFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXglFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 12) {
        error(Metadata::KTXglFormatInvalidSize, size);
        return;
    }

    struct Value {
        uint32_t glInternalformat = 0;
        uint32_t glFormat = 0;
        uint32_t glType = 0;
    };

    Value value{};
    std::memcpy(&value, data, size);

    if (value.glFormat != 0 || value.glType != 0) {
        if (isSupercompressionBlockCompressed(ktxSupercmpScheme(header.supercompressionScheme)))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(ktxSupercmpScheme(header.supercompressionScheme)));

        else if (parsedColorModel && isColorModelBlockCompressed(*parsedColorModel))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(*parsedColorModel));
    }
}